

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

void __thiscall
chrono::ChClassRegistration<chrono::ChSphereShape>::ChClassRegistration
          (ChClassRegistration<chrono::ChSphereShape> *this,char *mtag_name)

{
  (this->super_ChClassRegistrationBase)._vptr_ChClassRegistrationBase =
       (_func_int **)&PTR_create_0118c518;
  (this->m_sTagName)._M_dataplus._M_p = (pointer)&(this->m_sTagName).field_2;
  (this->m_sTagName)._M_string_length = 0;
  (this->m_sTagName).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&this->m_sTagName);
  ChClassFactory::ClassRegister(&this->m_sTagName,&this->super_ChClassRegistrationBase);
  return;
}

Assistant:

ChClassRegistration(const char* mtag_name) {
        // set name using the 'fake' RTTI system of Chrono
        this->m_sTagName = mtag_name; //t::FactoryClassNameTag();

        // register in global class factory
        ChClassFactory::ClassRegister(this->m_sTagName, this);
    }